

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O2

string * __thiscall
iDynTree::LinkContactWrenches::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkContactWrenches *this,Model *model)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pCVar4;
  pointer pCVar5;
  long lVar6;
  ostream *poVar7;
  long linkIndex;
  long lVar8;
  bool bVar9;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pvVar1 = (this->m_linkContactWrenches).
           super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (this->m_linkContactWrenches).
           super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (linkIndex = 0; linkIndex != ((long)pvVar1 - (long)pvVar2) / 0x18; linkIndex = linkIndex + 1)
  {
    pvVar3 = (this->m_linkContactWrenches).
             super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = *(pointer *)
              ((long)&pvVar3[linkIndex].
                      super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                      ._M_impl + 8);
    pCVar5 = *(pointer *)
              &pvVar3[linkIndex].
               super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
               ._M_impl;
    lVar6 = ((long)pCVar4 - (long)pCVar5) / 0x58;
    if (pCVar4 != pCVar5) {
      poVar7 = std::operator<<(local_1a8,"Contact wrenches on link ");
      Model::getLinkName_abi_cxx11_(&local_1f8,model,linkIndex);
      poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
      poVar7 = std::operator<<(poVar7,":");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&local_1f8);
      lVar8 = 0x20;
      while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
        poVar7 = std::operator<<(local_1a8,"Wrench contact with pos: ");
        iDynTree::Position::toString_abi_cxx11_();
        poVar7 = std::operator<<(poVar7,(string *)&local_1f8);
        poVar7 = std::operator<<(poVar7,",wrench: ");
        SpatialVector<iDynTree::SpatialForceVector>::toString_abi_cxx11_
                  (&local_1d8,
                   (SpatialVector<iDynTree::SpatialForceVector> *)
                   (*(long *)&(this->m_linkContactWrenches).
                              super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[linkIndex].
                              super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                              ._M_impl + lVar8));
        poVar7 = std::operator<<(poVar7,(string *)&local_1d8);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        lVar8 = lVar8 + 0x58;
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string LinkContactWrenches::toString(const Model& model) const
{
    std::stringstream ss;

    size_t nrOfLinks = m_linkContactWrenches.size();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        size_t nrOfContacts = this->getNrOfContactsForLink(l);

        if( nrOfContacts > 0 )
        {
            ss << "Contact wrenches on link " << model.getLinkName(l) << ":" << std::endl;
            for(size_t c=0; c < nrOfContacts; c++ )
            {
                ss << "Wrench contact with pos: " << this->contactWrench(l,c).contactPoint().toString() << ","
                                          "wrench: " << this->contactWrench(l,c).contactWrench().toString() << std::endl;
            }
        }
    }
    return ss.str();
}